

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpack11.cpp
# Opt level: O0

bool __thiscall msgpack11::MsgPackInt64::equals(MsgPackInt64 *this,MsgPackValue *other)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t iVar2;
  MsgPackValue *other_local;
  MsgPackInt64 *this_local;
  
  iVar1 = (*other->_vptr_MsgPackValue[3])();
  if (iVar1 == 6) {
    iVar2 = NumberValue<(msgpack11::MsgPack::Type)6,_long>::int64_value
                      (&this->super_NumberValue<(msgpack11::MsgPack::Type)6,_long>);
    iVar1 = (*other->_vptr_MsgPackValue[0xb])();
    this_local._7_1_ = iVar2 == CONCAT44(extraout_var,iVar1);
  }
  else if (iVar1 == 10) {
    iVar1 = (*other->_vptr_MsgPackValue[0xf])();
    iVar2 = NumberValue<(msgpack11::MsgPack::Type)6,_long>::int64_value
                      (&this->super_NumberValue<(msgpack11::MsgPack::Type)6,_long>);
    this_local._7_1_ = equal_uint64_int64(CONCAT44(extraout_var_00,iVar1),iVar2);
  }
  else {
    this_local._7_1_ =
         NumberValue<(msgpack11::MsgPack::Type)6,_long>::equals
                   (&this->super_NumberValue<(msgpack11::MsgPack::Type)6,_long>,other);
  }
  return this_local._7_1_;
}

Assistant:

bool equals(const MsgPackValue * other) const override
    {
        switch( other->type() )
        {
            case MsgPack::INT64 :
            {
                return int64_value() == other->int64_value();
            } break;
            case MsgPack::UINT64 :
            {
                return equal_uint64_int64( other->uint64_value(), int64_value() );
            } break;
            default :
            {
                return NumberValue<MsgPack::INT64, int64_t>::equals( other );
            }
        }
    }